

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

int Abc_SclFindBestCell(SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vRecalcs,Vec_Int_t *vEvals,int Notches,
                       int DelayGap,float *pGainBest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Flt_t *pVVar8;
  SC_Pair *pSVar9;
  int *piVar10;
  long lVar11;
  float *pfVar12;
  Abc_Ntk_t *pAVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  SC_Cell *pNew;
  float fVar20;
  float fVar21;
  float local_5c;
  SC_Cell *local_58;
  int local_4c;
  
  iVar15 = pObj->Id;
  if (-1 < (long)iVar15) {
    pVVar5 = pObj->pNtk->vGates;
    if (iVar15 < pVVar5->nSize) {
      uVar14 = pVVar5->pArray[iVar15];
      if ((ulong)uVar14 == 0xffffffff) {
        local_58 = (SC_Cell *)0x0;
      }
      else {
        if (((int)uVar14 < 0) ||
           (pvVar6 = pObj->pNtk->pSCLib, *(int *)((long)pvVar6 + 100) <= (int)uVar14)) {
LAB_00475e05:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        local_58 = *(SC_Cell **)(*(long *)((long)pvVar6 + 0x68) + (ulong)uVar14 * 8);
      }
      p->vTimes2->nSize = 0;
      iVar15 = vRecalcs->nSize;
      if (0 < iVar15) {
        lVar19 = 0;
        do {
          iVar18 = vRecalcs->pArray[lVar19];
          if (((long)iVar18 < 0) || (pVVar7 = p->pNtk->vObjs, pVVar7->nSize <= iVar18))
          goto LAB_00475e05;
          pvVar6 = pVVar7->pArray[iVar18];
          if (pvVar6 != (void *)0x0) {
            pVVar8 = p->vTimes2;
            fVar20 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].rise;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            pVVar8 = p->vTimes2;
            fVar20 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].fall;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            pVVar8 = p->vTimes2;
            fVar20 = p->pSlews[*(uint *)((long)pvVar6 + 0x10)].rise;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            pVVar8 = p->vTimes2;
            fVar20 = p->pSlews[*(uint *)((long)pvVar6 + 0x10)].fall;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            iVar15 = vRecalcs->nSize;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar15);
      }
      p->vTimes3->nSize = 0;
      iVar15 = vEvals->nSize;
      if (0 < iVar15) {
        lVar19 = 0;
        do {
          iVar18 = vEvals->pArray[lVar19];
          if (((long)iVar18 < 0) || (pVVar7 = p->pNtk->vObjs, pVVar7->nSize <= iVar18))
          goto LAB_00475e05;
          pvVar6 = pVVar7->pArray[iVar18];
          if (pvVar6 != (void *)0x0) {
            pVVar8 = p->vTimes3;
            fVar20 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].rise;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            pVVar8 = p->vTimes3;
            fVar20 = p->pTimes[*(uint *)((long)pvVar6 + 0x10)].fall;
            uVar14 = pVVar8->nSize;
            if (uVar14 == pVVar8->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc(0x40);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = 0x10;
              }
              else {
                if (pVVar8->pArray == (float *)0x0) {
                  pfVar12 = (float *)malloc((ulong)uVar14 * 8);
                }
                else {
                  pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
                }
                pVVar8->pArray = pfVar12;
                pVVar8->nCap = uVar14 * 2;
              }
            }
            else {
              pfVar12 = pVVar8->pArray;
            }
            iVar15 = pVVar8->nSize;
            pVVar8->nSize = iVar15 + 1;
            pfVar12[iVar15] = fVar20;
            iVar15 = vEvals->nSize;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar15);
      }
      p->vLoads2->nSize = 0;
      if (0 < (pObj->vFanins).nSize) {
        lVar19 = 0;
        do {
          pvVar6 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar19]];
          pVVar8 = p->vLoads2;
          fVar20 = p->pLoads[*(uint *)((long)pvVar6 + 0x10)].rise;
          uVar14 = pVVar8->nSize;
          if (uVar14 == pVVar8->nCap) {
            if ((int)uVar14 < 0x10) {
              if (pVVar8->pArray == (float *)0x0) {
                pfVar12 = (float *)malloc(0x40);
              }
              else {
                pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
              }
              pVVar8->pArray = pfVar12;
              pVVar8->nCap = 0x10;
            }
            else {
              if (pVVar8->pArray == (float *)0x0) {
                pfVar12 = (float *)malloc((ulong)uVar14 * 8);
              }
              else {
                pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
              }
              pVVar8->pArray = pfVar12;
              pVVar8->nCap = uVar14 * 2;
            }
          }
          else {
            pfVar12 = pVVar8->pArray;
          }
          iVar15 = pVVar8->nSize;
          pVVar8->nSize = iVar15 + 1;
          pfVar12[iVar15] = fVar20;
          pVVar8 = p->vLoads2;
          fVar20 = p->pLoads[*(uint *)((long)pvVar6 + 0x10)].fall;
          uVar14 = pVVar8->nSize;
          if (uVar14 == pVVar8->nCap) {
            if ((int)uVar14 < 0x10) {
              if (pVVar8->pArray == (float *)0x0) {
                pfVar12 = (float *)malloc(0x40);
              }
              else {
                pfVar12 = (float *)realloc(pVVar8->pArray,0x40);
              }
              pVVar8->pArray = pfVar12;
              pVVar8->nCap = 0x10;
            }
            else {
              if (pVVar8->pArray == (float *)0x0) {
                pfVar12 = (float *)malloc((ulong)uVar14 * 8);
              }
              else {
                pfVar12 = (float *)realloc(pVVar8->pArray,(ulong)uVar14 * 8);
              }
              pVVar8->pArray = pfVar12;
              pVVar8->nCap = uVar14 * 2;
            }
          }
          else {
            pfVar12 = pVVar8->pArray;
          }
          iVar15 = pVVar8->nSize;
          pVVar8->nSize = iVar15 + 1;
          pfVar12[iVar15] = fVar20;
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pObj->vFanins).nSize);
      }
      local_5c = (float)-DelayGap;
      local_4c = -1;
      iVar15 = 0;
      iVar18 = 0;
      pNew = local_58;
      do {
        if (pNew != local_58) {
          pAVar13 = pObj->pNtk;
          if (Notches < iVar18) goto LAB_00475ca3;
          iVar2 = pObj->Id;
          if (((long)iVar2 < 0) || (pAVar13->vGates->nSize <= iVar2)) goto LAB_00475e24;
          pAVar13->vGates->pArray[iVar2] = pNew->Id;
          Abc_SclUpdateLoad(p,pObj,local_58,pNew);
          Abc_SclTimeCone(p,vRecalcs);
          iVar2 = pObj->Id;
          if ((long)iVar2 < 0) goto LAB_00475e24;
          pAVar13 = pObj->pNtk;
          if (pAVar13->vGates->nSize <= iVar2) goto LAB_00475e24;
          pAVar13->vGates->pArray[iVar2] = local_58->Id;
          lVar19 = (long)(pObj->vFanins).nSize;
          pVVar8 = p->vLoads2;
          uVar14 = pVVar8->nSize;
          if (lVar19 < 1) {
            uVar17 = 0;
          }
          else {
            uVar16 = 0;
            if (0 < (int)uVar14) {
              uVar16 = uVar14;
            }
            uVar17 = 0;
            do {
              if ((uVar16 + 1 & 0xfffffffe) == uVar17) goto LAB_00475de6;
              pfVar12 = pVVar8->pArray;
              pSVar9 = p->pLoads;
              uVar3 = *(uint *)((long)pAVar13->vObjs->pArray
                                      [*(int *)((long)(pObj->vFanins).pArray + uVar17 * 2)] + 0x10);
              pSVar9[uVar3].rise = pfVar12[uVar17];
              if ((uVar14 & 0xfffffffe) == uVar17) goto LAB_00475de6;
              lVar11 = uVar17 + 1;
              uVar17 = uVar17 + 2;
              pSVar9[uVar3].fall = pfVar12[lVar11];
            } while (lVar19 * 2 != uVar17);
          }
          if (uVar14 != (uint)uVar17) {
            __assert_fail("Vec_FltSize(p->vLoads2) == k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                          ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
          }
          iVar2 = vEvals->nSize;
          if ((long)iVar2 < 1) {
            uVar14 = 0;
            fVar20 = 0.0;
          }
          else {
            pVVar7 = p->pNtk->vObjs;
            fVar20 = 0.0;
            lVar19 = 0;
            uVar14 = 0;
            do {
              iVar4 = vEvals->pArray[lVar19];
              if (((long)iVar4 < 0) || (pVVar7->nSize <= iVar4)) goto LAB_00475e05;
              pvVar6 = pVVar7->pArray[iVar4];
              if (pvVar6 != (void *)0x0) {
                if ((int)uVar14 < 0) goto LAB_00475de6;
                uVar16 = p->vTimes3->nSize;
                if (((int)uVar16 <= (int)uVar14) || (uVar3 = uVar14 + 1, uVar16 <= uVar3))
                goto LAB_00475de6;
                pfVar12 = p->vTimes3->pArray;
                uVar17 = (ulong)uVar14;
                uVar14 = uVar14 + 2;
                fVar21 = (pfVar12[uVar3] - p->pTimes[*(uint *)((long)pvVar6 + 0x10)].fall) +
                         (pfVar12[uVar17] - p->pTimes[*(uint *)((long)pvVar6 + 0x10)].rise);
                fVar20 = (float)(~-(uint)(0.0 < fVar21) & (uint)(fVar21 * 1.5) |
                                (uint)fVar21 & -(uint)(0.0 < fVar21)) * 0.5 + fVar20;
              }
              lVar19 = lVar19 + 1;
            } while (iVar2 != lVar19);
          }
          if (p->vTimes3->nSize != uVar14) {
            __assert_fail("Vec_FltSize(p->vTimes3) == k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                          ,0x183,"float Abc_SclEvalPerform(SC_Man *, Vec_Int_t *)");
          }
          if (fVar20 / (float)iVar2 <= local_5c) {
            if (iVar15 == 0) {
              iVar15 = 0;
            }
            else {
              iVar15 = iVar15 + 1;
              if (iVar15 == 4) goto LAB_00475ca3;
            }
          }
          else {
            local_4c = pNew->Id;
            iVar15 = 1;
            local_5c = fVar20 / (float)iVar2;
          }
        }
        pNew = pNew->pNext;
        iVar18 = iVar18 + 1;
      } while (pNew != local_58);
      pAVar13 = pObj->pNtk;
LAB_00475ca3:
      iVar15 = pObj->Id;
      if (((long)iVar15 < 0) || (pAVar13->vGates->nSize <= iVar15)) {
LAB_00475e24:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pAVar13->vGates->pArray[iVar15] = local_58->Id;
      iVar15 = vRecalcs->nSize;
      if ((long)iVar15 < 1) {
        uVar14 = 0;
      }
      else {
        piVar10 = vRecalcs->pArray;
        pVVar7 = p->pNtk->vObjs;
        lVar19 = 0;
        uVar14 = 0;
        do {
          iVar18 = piVar10[lVar19];
          if (((long)iVar18 < 0) || (pVVar7->nSize <= iVar18)) goto LAB_00475e05;
          pvVar6 = pVVar7->pArray[iVar18];
          if (pvVar6 != (void *)0x0) {
            if ((int)uVar14 < 0) {
LAB_00475de6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                            ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
            }
            uVar16 = p->vTimes2->nSize;
            if ((int)uVar16 <= (int)uVar14) goto LAB_00475de6;
            pfVar12 = p->vTimes2->pArray;
            pSVar9 = p->pTimes;
            uVar3 = *(uint *)((long)pvVar6 + 0x10);
            pSVar9[uVar3].rise = pfVar12[uVar14];
            if (uVar16 <= uVar14 + 1) goto LAB_00475de6;
            pSVar9[uVar3].fall = pfVar12[uVar14 + 1];
            if (uVar16 <= uVar14 + 2) goto LAB_00475de6;
            uVar1 = uVar14 + 3;
            pSVar9 = p->pSlews;
            pSVar9[uVar3].rise = pfVar12[uVar14 + 2];
            if (uVar16 <= uVar1) goto LAB_00475de6;
            uVar14 = uVar14 + 4;
            pSVar9[uVar3].fall = pfVar12[uVar1];
          }
          lVar19 = lVar19 + 1;
        } while (iVar15 != lVar19);
      }
      if (p->vTimes2->nSize != uVar14) {
        __assert_fail("Vec_FltSize(p->vTimes2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                      ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
      }
      *pGainBest = local_5c;
      return local_4c;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_SclFindBestCell( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vRecalcs, Vec_Int_t * vEvals, int Notches, int DelayGap, float * pGainBest )
{
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int k, gateBest, NoChange = 0;
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vRecalcs );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCell( pCellOld, pCellNew, k )
    {
        if ( pCellNew == pCellOld )
            continue;
        if ( k > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vRecalcs );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // save best gain
        dGain = Abc_SclEvalPerform( p, vEvals );
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
            NoChange = 1;
        }
        else if ( NoChange )
            NoChange++;
        if ( NoChange == 4 )
            break;
//        printf( "%.2f ", dGain );
    }
//    printf( "Best = %.2f   ", dGainBest );
//    printf( "\n" );
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vRecalcs );
    *pGainBest = dGainBest;
    return gateBest;
}